

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall
OpenMD::Integrator::setRNEMD
          (Integrator *this,
          unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *rnemd)

{
  unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *in_RSI;
  unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
  *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void Integrator::setRNEMD(std::unique_ptr<RNEMD::RNEMD> rnemd) {
    rnemd_ = std::move(rnemd);
  }